

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::PrimitiveSymbol::serializeTo(PrimitiveSymbol *this,ASTSerializer *serializer)

{
  long lVar1;
  char *pcVar2;
  string_view name;
  
  ASTSerializer::write(serializer,0xc,"isSequential",(ulong)this->isSequential);
  if (this->initVal != (ConstantValue *)0x0) {
    ASTSerializer::write(serializer,7,"initVal",(size_t)this->initVal);
  }
  if ((this->table)._M_extent._M_extent_value != 0) {
    name._M_str = "table";
    name._M_len = 5;
    ASTSerializer::startArray(serializer,name);
    pcVar2 = &((this->table)._M_ptr)->state;
    for (lVar1 = (this->table)._M_extent._M_extent_value * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18)
    {
      ASTSerializer::startObject(serializer);
      ASTSerializer::write(serializer,6,"inputs",(((TableEntry *)(pcVar2 + -0x10))->inputs)._M_len);
      if (*pcVar2 != '\0') {
        ASTSerializer::write(serializer,5,"state",1);
      }
      ASTSerializer::write(serializer,6,"output",1);
      ASTSerializer::endObject(serializer);
      pcVar2 = pcVar2 + 0x18;
    }
    ASTSerializer::endArray(serializer);
    return;
  }
  return;
}

Assistant:

void PrimitiveSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("isSequential", isSequential);
    if (initVal)
        serializer.write("initVal", *initVal);

    if (!table.empty()) {
        serializer.startArray("table");
        for (auto& row : table) {
            serializer.startObject();
            serializer.write("inputs", row.inputs);
            if (row.state)
                serializer.write("state", std::string_view(&row.state, 1));
            serializer.write("output", std::string_view(&row.output, 1));
            serializer.endObject();
        }
        serializer.endArray();
    }
}